

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::imbue(path *this,locale *loc)

{
  locale *plVar1;
  locale *loc_local;
  locale *temp;
  
  plVar1 = anon_unknown.dwarf_f716::path_locale();
  std::locale::locale((locale *)this,plVar1);
  plVar1 = anon_unknown.dwarf_f716::path_locale();
  std::locale::operator=(plVar1,loc);
  return this;
}

Assistant:

std::locale path::imbue(const std::locale& loc)
  {
#ifdef BOOST_FILESYSTEM_DEBUG
    std::cout << "***** path::imbue() called" << std::endl;
#endif
    std::locale temp(path_locale());
    path_locale() = loc;
    return temp;
  }